

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

UtcTimeOnly * FIX::UtcTimeOnlyConvertor::convert(UtcTimeOnly *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  char *pcVar2;
  FieldConvertError *this;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar1 = value->_M_string_length;
  if (uVar1 - 0x13 < 0xfffffffffffffff5) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    pcVar2 = (value->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      if (9 < (int)pcVar2[lVar4] - 0x30U) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_0015e4f1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    if (pcVar2[2] == ':') {
      iVar6 = (int)pcVar2[3];
      if (iVar6 - 0x30U < 10) {
        iVar3 = (int)pcVar2[4];
        if (iVar3 - 0x30U < 10) {
          if (pcVar2[5] == ':') {
            iVar9 = (int)pcVar2[6];
            if ((iVar9 - 0x30U < 10) && (iVar8 = (int)pcVar2[7], iVar8 - 0x30U < 10)) {
              if ((int)pcVar2[1] + *pcVar2 * 10 + -0x1e0 < 0x48) {
                if ((iVar3 + iVar6 * 10) - 0x1e0U < 0x6c) {
                  if ((iVar8 + iVar9 * 10) - 0x1e0U < 0x6d) {
                    iVar10 = (int)pcVar2[1] + *pcVar2 * 10 + -0x210;
                    iVar6 = iVar3 + iVar6 * 10 + -0x210;
                    uVar7 = (iVar8 + iVar9 * 10) - 0x210;
                    if (uVar1 == 8) {
                      (__return_storage_ptr__->super_DateTime).m_date = 0;
                      (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
                           (_func_int **)&PTR__DateTime_001eab90;
                      lVar4 = ((ulong)uVar7 + (long)(iVar6 * 0x3c + iVar10 * 0xe10)) * 1000000000;
                    }
                    else {
                      if (pcVar2[8] != '.') {
                        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                        FieldConvertError::FieldConvertError(this,value);
                        goto LAB_0015e4f1;
                      }
                      iVar3 = 0;
                      if (9 < uVar1) {
                        uVar5 = 9;
                        iVar3 = 0;
                        do {
                          if (9 < (int)pcVar2[uVar5] - 0x30U) {
                            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                            FieldConvertError::FieldConvertError(this,value);
                            goto LAB_0015e4f1;
                          }
                          iVar3 = (int)pcVar2[uVar5] + iVar3 * 10 + -0x30;
                          uVar5 = uVar5 + 1;
                        } while (uVar1 != uVar5);
                      }
                      (__return_storage_ptr__->super_DateTime).m_date = 0;
                      (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
                           (_func_int **)&PTR__DateTime_001eab90;
                      iVar3 = DateTime::convertToNanos(iVar3,(int)uVar1 + -9);
                      lVar4 = (long)iVar3 +
                              ((long)(int)uVar7 + (long)(iVar6 * 0x3c + iVar10 * 0xe10)) *
                              1000000000;
                    }
                    (__return_storage_ptr__->super_DateTime).m_time = lVar4;
                    return __return_storage_ptr__;
                  }
                  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                  FieldConvertError::FieldConvertError(this,value);
                }
                else {
                  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                  FieldConvertError::FieldConvertError(this,value);
                }
              }
              else {
                this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                FieldConvertError::FieldConvertError(this,value);
              }
            }
            else {
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
          }
          else {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
          goto LAB_0015e4f1;
        }
      }
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
    else {
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
  }
LAB_0015e4f1:
  __cxa_throw(this,&FieldConvertError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

static UtcTimeOnly convert( const std::string& value)
  EXCEPT ( FieldConvertError )
  {
    size_t len = value.size();
    if (len < 8 || len > 18) throw FieldConvertError(value);

    size_t i = 0;
    int c = 0;
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);

    int hour, min, sec;

    i = 0;

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 23 < hour ) throw FieldConvertError(value);

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 59 < min ) throw FieldConvertError(value);

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if( 60 < sec ) throw FieldConvertError(value);

    if (len == 8)
      return UtcTimeOnly (hour, min, sec, 0);

    if( value[i++] != '.' ) throw FieldConvertError(value);

    int fraction = 0;
    for (; i < len; ++i)
    {
      char ch = value[i];
      if( !IS_DIGIT(ch)) throw FieldConvertError(value);
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeOnly (hour, min, sec, fraction, len - 8 - 1);
  }